

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

SharedPtrArray<solitaire::piles::FoundationPileMock,_4UL> * __thiscall
solitaire::SolitaireTest::makeSharedPtrArray<solitaire::piles::FoundationPileMock,4ul>
          (SharedPtrArray<solitaire::piles::FoundationPileMock,_4UL> *__return_storage_ptr__,
          SolitaireTest *this)

{
  SharedPtrArray<solitaire::piles::FoundationPileMock,_4UL> *__range2;
  long lVar1;
  __shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __return_storage_ptr__->_M_elems[3].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[3].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->_M_elems[2].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[2].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->_M_elems[1].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[1].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->_M_elems[0].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[0].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    std::make_shared<solitaire::piles::FoundationPileMock>();
    std::__shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&__return_storage_ptr__->_M_elems[0].
                       super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar1),&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

SharedPtrArray<T, N> makeSharedPtrArray() {
        SharedPtrArray<T, N> result;
        for (auto& ptr: result)
            ptr = std::make_shared<T>();
        return result;
    }